

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition-graph.hxx
# Opt level: O0

void __thiscall
lineage::heuristics::PartitionGraph::updateEdgeCost(PartitionGraph *this,size_t edgeId,double delta)

{
  vector<double,_std::allocator<double>_> *pvVar1;
  vector<double,_std::allocator<double>_> *pvVar2;
  reference pvVar3;
  vector<double,_std::allocator<double>_> *in_RSI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  double *in_stack_ffffffffffffffc8;
  vector<double,_std::allocator<double>_> *pvVar4;
  
  pvVar4 = in_RSI;
  pvVar1 = (vector<double,_std::allocator<double>_> *)
           std::vector<double,_std::allocator<double>_>::size
                     ((vector<double,_std::allocator<double>_> *)
                      &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
  if (in_RSI == pvVar1) {
    std::vector<double,std::allocator<double>>::emplace_back<double&>
              (in_RDI,in_stack_ffffffffffffffc8);
  }
  else {
    pvVar1 = pvVar4;
    pvVar2 = (vector<double,_std::allocator<double>_> *)
             std::vector<double,_std::allocator<double>_>::size
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish);
    if (pvVar2 < pvVar4) {
      std::vector<double,_std::allocator<double>_>::resize
                (pvVar1,(size_type)in_XMM0_Qa,(value_type_conflict2 *)0x0);
    }
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &in_RDI[2].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish,(size_type)pvVar1);
    *pvVar3 = in_XMM0_Qa + *pvVar3;
  }
  return;
}

Assistant:

void updateEdgeCost(size_t edgeId, double delta)
    {
        // NOTE you have to check whether the edge has vanished!
        if (edgeId == branchingEdgeCosts_.size()) {
            branchingEdgeCosts_.emplace_back(delta);
            return;
        } else if (edgeId > branchingEdgeCosts_.size()) {
            branchingEdgeCosts_.resize(edgeId + 1, 0);
        }
        branchingEdgeCosts_[edgeId] += delta;
    }